

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

int NetmaskBits(uint8_t x)

{
  undefined7 in_register_00000039;
  long in_FS_OFFSET;
  int iStack_10;
  
  iStack_10 = (int)CONCAT71(in_register_00000039,x);
  switch(iStack_10) {
  case 0xf8:
    iStack_10 = 5;
    break;
  case 0xfc:
    iStack_10 = 6;
    break;
  case 0xfe:
    iStack_10 = 7;
    break;
  case 0xff:
    iStack_10 = 8;
    break;
  default:
    if (iStack_10 == 0) break;
    if (iStack_10 == 0xf0) {
      iStack_10 = 4;
      break;
    }
    if (iStack_10 == 0xc0) {
      iStack_10 = 2;
      break;
    }
    if (iStack_10 == 0xe0) {
      iStack_10 = 3;
      break;
    }
    if (iStack_10 == 0x80) {
      iStack_10 = 1;
      break;
    }
  case 0xf9:
  case 0xfa:
  case 0xfb:
  case 0xfd:
    iStack_10 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return iStack_10;
}

Assistant:

static inline int NetmaskBits(uint8_t x)
{
    switch(x) {
    case 0x00: return 0;
    case 0x80: return 1;
    case 0xc0: return 2;
    case 0xe0: return 3;
    case 0xf0: return 4;
    case 0xf8: return 5;
    case 0xfc: return 6;
    case 0xfe: return 7;
    case 0xff: return 8;
    default: return -1;
    }
}